

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsprg.cpp
# Opt level: O1

CTPNStmTop * __thiscall CTcParser::parse_template_def(CTcParser *this,int *err,CTcToken *class_tok)

{
  uint uVar1;
  byte *p;
  size_t len;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  tc_toktyp_t tVar6;
  wchar_t wVar7;
  CTcObjTemplateItem *item;
  CTcSymObjBase *this_00;
  char *pcVar8;
  CTcToken *pCVar9;
  CTcSymProp *pCVar10;
  ulong uVar11;
  CTcObjTemplateItem *pCVar12;
  CTcObjTemplateItem *pCVar13;
  CTcObjTemplateItem *pCVar14;
  CTcObjTemplateItem *item_cnt;
  CTcObjTemplateItem *pCVar15;
  byte *pbVar16;
  textchar_t *sym;
  tc_toktyp_t op;
  bool bVar17;
  byte *p_00;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  CTcObjTemplateItem *local_88;
  size_t local_70;
  CTcToken prop_tok;
  tc_toktyp_t kwtok;
  
  if (class_tok != (CTcToken *)0x0) {
    iVar5 = CTcToken::text_matches(class_tok,"string");
    if (iVar5 != 0) {
      parse_string_template_def(this,err);
      return (CTPNStmTop *)0x0;
    }
    sym = class_tok->text_;
    this_00 = (CTcSymObjBase *)
              CTcPrsSymtab::find_noref
                        (this->global_symtab_,sym,class_tok->text_len_,(CTcPrsSymtab **)0x0);
    if (this_00 == (CTcSymObjBase *)0x0) {
      this_00 = (CTcSymObjBase *)CTcSymbolBase::operator_new((CTcSymbolBase *)0xc0,(size_t)sym);
      pcVar8 = class_tok->text_;
      len = class_tok->text_len_;
      uVar1 = G_cg->next_obj_;
      G_cg->next_obj_ = uVar1 + 1;
      CTcSymObjBase::CTcSymObjBase
                (this_00,pcVar8,len,0,(ulong)uVar1,1,TC_META_TADSOBJ,(CTcDictEntry *)0x0);
      (this_00->super_CTcSymbol).super_CTcSymbolBase.super_CVmHashEntryCS.super_CVmHashEntry.
      _vptr_CVmHashEntry = (_func_int **)&PTR__CVmHashEntry_00320710;
      (*this->global_symtab_->_vptr_CTcPrsSymtab[3])();
      goto LAB_001e01c3;
    }
    if ((*(int *)&(this_00->super_CTcSymbol).super_CTcSymbolBase.super_CVmHashEntryCS.
                  super_CVmHashEntry.field_0x24 == 2) && (this_00->metaclass_ == TC_META_TADSOBJ))
    goto LAB_001e01c3;
    CTcTokenizer::log_error_curtok(G_tok,0x2b60);
  }
  this_00 = (CTcSymObjBase *)0x0;
LAB_001e01c3:
  CTcTokenizer::next(G_tok);
  bVar2 = false;
  bVar3 = true;
  item_cnt = (CTcObjTemplateItem *)0x0;
  local_88 = (CTcObjTemplateItem *)0x0;
  bVar4 = false;
  local_70 = 0;
  pCVar13 = (CTcObjTemplateItem *)0x0;
  do {
    op = (G_tok->curtok_).typ_;
    if (0x3f < (int)op) {
      if ((int)op < 0x4f) {
        if ((op - TOKT_NOT < 2) || (op == TOKT_AT)) goto switchD_001e0232_caseD_15;
      }
      else {
        if (op == TOKT_INHERITED) {
          bVar18 = false;
          bVar4 = true;
          goto LAB_001e04c5;
        }
        if (op == TOKT_OBJECT) goto switchD_001e0232_caseD_17;
      }
      goto switchD_001e0232_caseD_b;
    }
    switch(op) {
    case TOKT_SSTR:
    case TOKT_DSTR:
      pCVar9 = CTcTokenizer::copycur(G_tok);
      prop_tok._32_1_ = pCVar9->field_0x20;
      prop_tok.typ_ = pCVar9->typ_;
      prop_tok._4_4_ = *(undefined4 *)&pCVar9->field_0x4;
      prop_tok.text_ = pCVar9->text_;
      prop_tok.text_len_ = pCVar9->text_len_;
      prop_tok.int_val_ = pCVar9->int_val_;
      op = (G_tok->curtok_).typ_;
      p = (byte *)(G_tok->curtok_).text_;
      pbVar16 = (byte *)(G_tok->curtok_).text_len_;
      if ((pbVar16 == (byte *)0x0) || (wVar7 = utf8_ptr::s_getch((char *)p), 0x7f < (uint)wVar7)) {
        bVar18 = false;
      }
      else {
        bVar18 = true;
        if (wVar7 != L'_') {
          iVar5 = isalpha(wVar7);
          bVar18 = iVar5 != 0;
        }
      }
      p_00 = p;
      if (pbVar16 != (byte *)0x0) {
        p_00 = p + (ulong)(((*p >> 5 & 1) != 0) + 1 & (uint)(*p >> 7) * 3) + 1;
        pbVar16 = p + ((long)pbVar16 - (long)p_00);
      }
      if (bVar18 && pbVar16 != (byte *)0x0) {
        do {
          wVar7 = utf8_ptr::s_getch((char *)p_00);
          if ((uint)wVar7 < 0x80) {
            bVar18 = true;
            if ((wVar7 != L'_') && (iVar5 = isalpha(wVar7), iVar5 == 0)) {
              bVar18 = (uint)(wVar7 + L'\xffffffd0') < 10;
            }
          }
          else {
            bVar18 = false;
          }
          pbVar16 = p_00 + ((long)pbVar16 -
                           (long)(p_00 + (ulong)(((*p_00 >> 5 & 1) != 0) + 1 &
                                                (uint)(*p_00 >> 7) * 3) + 1));
        } while ((pbVar16 != (byte *)0x0) &&
                (p_00 = p_00 + (ulong)(((*p_00 >> 5 & 1) != 0) + 1 & (uint)(*p_00 >> 7) * 3) + 1,
                bVar18));
      }
      if ((bVar18) &&
         (iVar5 = CTcTokenizer::look_up_keyword(G_tok,&G_tok->curtok_,&kwtok), iVar5 == 0)) {
        bVar19 = true;
      }
      else {
        CTcTokenizer::log_error_curtok(G_tok,0x2b96);
        bVar19 = false;
      }
      bVar18 = true;
      break;
    case TOKT_COMMA:
    case TOKT_PLUS:
    case TOKT_MINUS:
    case TOKT_TIMES:
    case TOKT_DIV:
    case TOKT_MOD:
    case TOKT_ARROW:
    case TOKT_AND:
switchD_001e0232_caseD_15:
      tVar6 = CTcTokenizer::next(G_tok);
      bVar19 = tVar6 == TOKT_SYM;
      if (!bVar19) {
        pcVar8 = CTcTokenizer::get_op_text(op);
        CTcTokenizer::log_error
                  (0x2b95,pcVar8,(ulong)(uint)(G_tok->curtok_).text_len_,(G_tok->curtok_).text_);
      }
      pCVar9 = CTcTokenizer::copycur(G_tok);
      prop_tok.typ_ = pCVar9->typ_;
      prop_tok._4_4_ = *(undefined4 *)&pCVar9->field_0x4;
      prop_tok.text_ = pCVar9->text_;
      prop_tok.text_len_ = pCVar9->text_len_;
      prop_tok.int_val_ = pCVar9->int_val_;
      prop_tok._32_1_ = pCVar9->field_0x20;
      goto LAB_001e0295;
    case TOKT_LBRACE:
    case TOKT_RBRACE:
switchD_001e0232_caseD_17:
      CTcTokenizer::log_error_curtok(G_tok,0x2b98);
      bVar18 = true;
      bVar19 = false;
      bVar2 = true;
      break;
    case TOKT_LBRACK:
      tVar6 = CTcTokenizer::next(G_tok);
      if (tVar6 == TOKT_SYM) {
        pCVar9 = CTcTokenizer::copycur(G_tok);
        prop_tok.typ_ = pCVar9->typ_;
        prop_tok._4_4_ = *(undefined4 *)&pCVar9->field_0x4;
        prop_tok.text_ = pCVar9->text_;
        prop_tok.text_len_ = pCVar9->text_len_;
        prop_tok.int_val_ = pCVar9->int_val_;
        prop_tok._32_1_ = pCVar9->field_0x20;
        tVar6 = CTcTokenizer::next(G_tok);
        if (tVar6 != TOKT_RBRACK) {
          CTcTokenizer::log_error_curtok(G_tok,0x2b97);
        }
        bVar19 = true;
      }
      else {
        pcVar8 = CTcTokenizer::get_op_text(op);
        bVar19 = false;
        CTcTokenizer::log_error
                  (0x2b95,pcVar8,(ulong)(uint)(G_tok->curtok_).text_len_,(G_tok->curtok_).text_);
        uVar11 = (ulong)(G_tok->curtok_).typ_;
        if ((0x2a < uVar11) || ((0x40005800004U >> (uVar11 & 0x3f) & 1) == 0)) {
          CTcTokenizer::next(G_tok);
        }
      }
LAB_001e0295:
      bVar18 = true;
      break;
    case TOKT_SEM:
      CTcTokenizer::next(G_tok);
      bVar18 = true;
      bVar2 = true;
LAB_001e04c5:
      bVar19 = true;
      break;
    default:
      if (op == TOKT_EOF) goto switchD_001e0232_caseD_17;
    case TOKT_SSTR_START:
    case TOKT_SSTR_MID:
    case TOKT_SSTR_END:
    case TOKT_DSTR_START:
    case TOKT_DSTR_MID:
    case TOKT_DSTR_END:
    case TOKT_RESTR:
    case TOKT_LPAR:
    case TOKT_RPAR:
    case TOKT_DOT:
    case TOKT_RBRACK:
    case TOKT_EQ:
    case TOKT_EQEQ:
    case TOKT_ASI:
    case TOKT_GT:
    case TOKT_LT:
    case TOKT_GE:
    case TOKT_LE:
    case TOKT_NE:
    case TOKT_COLON:
switchD_001e0232_caseD_b:
      CTcTokenizer::log_error_curtok(G_tok,0x2b98);
      CTcTokenizer::next(G_tok);
      bVar18 = true;
      bVar19 = false;
    }
    bVar17 = false;
    bVar21 = true;
    if (bVar2) {
      bVar20 = false;
    }
    else {
      CTcTokenizer::next(G_tok);
      bVar20 = (G_tok->curtok_).typ_ == TOKT_QUESTION;
      if (bVar20) {
        CTcTokenizer::next(G_tok);
      }
      bVar21 = (G_tok->curtok_).typ_ != TOKT_OR;
      if (!bVar21) {
        CTcTokenizer::next(G_tok);
      }
      bVar17 = !bVar21;
    }
    if ((pCVar13 != (CTcObjTemplateItem *)0x0) && ((pCVar13->field_0x18 & 1) != 0)) {
      pCVar12 = item_cnt;
      if (bVar20) {
        for (; pCVar12 != (CTcObjTemplateItem *)0x0; pCVar12 = pCVar12->nxt_) {
          pCVar12->field_0x18 = pCVar12->field_0x18 | 2;
        }
      }
      if ((pCVar13->field_0x18 & 2) != 0) {
        bVar20 = true;
      }
    }
    if (!bVar19) {
      bVar3 = false;
    }
    if (bVar19 && !bVar2) {
      if (bVar18) {
        pCVar10 = look_up_prop(this,&prop_tok,0);
        if (pCVar10 == (CTcSymProp *)0x0) {
          iVar5 = 0x2b99;
          pcVar8 = prop_tok.text_;
          uVar1 = (uint)prop_tok.text_len_;
        }
        else {
          pCVar12 = local_88;
          if (((pCVar10->super_CTcSymPropBase).field_0x2a & 2) == 0) {
            for (; pCVar12 != (CTcObjTemplateItem *)0x0; pCVar12 = pCVar12->nxt_) {
              if (pCVar12->prop_ == pCVar10) {
                pCVar14 = pCVar12;
                if ((pCVar12->field_0x18 & 1) == 0) {
                  CTcTokenizer::log_error
                            (0x2b9c,(ulong)(uint)(pCVar10->super_CTcSymPropBase).super_CTcSymbol.
                                                 super_CTcSymbolBase.super_CVmHashEntryCS.
                                                 super_CVmHashEntry.len_,
                             (pCVar10->super_CTcSymPropBase).super_CTcSymbol.super_CTcSymbolBase.
                             super_CVmHashEntryCS.super_CVmHashEntry.str_);
                  break;
                }
                do {
                  pCVar14 = pCVar14->nxt_;
                  if (pCVar14 == (CTcObjTemplateItem *)0x0) goto LAB_001e062a;
                } while ((pCVar14->field_0x18 & 1) != 0);
                CTcTokenizer::log_error
                          (0x2b9c,(ulong)(uint)(pCVar10->super_CTcSymPropBase).super_CTcSymbol.
                                               super_CTcSymbolBase.super_CVmHashEntryCS.
                                               super_CVmHashEntry.len_,
                           (pCVar10->super_CTcSymPropBase).super_CTcSymbol.super_CTcSymbolBase.
                           super_CVmHashEntryCS.super_CVmHashEntry.str_);
                if (pCVar14 != (CTcObjTemplateItem *)0x0) break;
              }
LAB_001e062a:
            }
            pCVar12 = (CTcObjTemplateItem *)CTcPrsMem::alloc(G_prsmem,0x20);
            pCVar12->prop_ = pCVar10;
            pCVar12->tok_type_ = op;
            pCVar12->field_0x18 = bVar20 * '\x02' | bVar17 | pCVar12->field_0x18 & 0xfc;
            pCVar12->nxt_ = (CTcObjTemplateItem *)0x0;
            goto LAB_001e0777;
          }
          iVar5 = 0x2b9b;
          pcVar8 = (pCVar10->super_CTcSymPropBase).super_CTcSymbol.super_CTcSymbolBase.
                   super_CVmHashEntryCS.super_CVmHashEntry.str_;
          uVar1 = (uint)(pCVar10->super_CTcSymPropBase).super_CTcSymbol.super_CTcSymbolBase.
                        super_CVmHashEntryCS.super_CVmHashEntry.len_;
        }
        CTcTokenizer::log_error(iVar5,(ulong)uVar1,pcVar8);
        pCVar12 = (CTcObjTemplateItem *)0x0;
      }
      else {
        pCVar12 = (CTcObjTemplateItem *)CTcPrsMem::alloc(G_prsmem,0x20);
        pCVar12->prop_ = (CTcSymProp *)0x0;
        pCVar12->tok_type_ = TOKT_INHERITED;
        pCVar12->field_0x18 = pCVar12->field_0x18 & 0xfc;
        pCVar12->nxt_ = (CTcObjTemplateItem *)0x0;
      }
LAB_001e0777:
      if (pCVar12 != (CTcObjTemplateItem *)0x0) {
        pCVar14 = pCVar12;
        if (bVar21) {
          pCVar14 = (CTcObjTemplateItem *)0x0;
        }
        if ((pCVar13 != (CTcObjTemplateItem *)0x0 && !bVar21) &&
           (pCVar14 = item_cnt, (pCVar13->field_0x18 & 1) == 0)) {
          pCVar14 = pCVar12;
        }
        pCVar15 = pCVar12;
        if (pCVar13 != (CTcObjTemplateItem *)0x0) {
          pCVar13->nxt_ = pCVar12;
          pCVar15 = local_88;
        }
        local_70 = local_70 + 1;
        pCVar13 = pCVar12;
        item_cnt = pCVar14;
        local_88 = pCVar15;
      }
    }
    if (bVar2) {
      if (local_70 == 0) {
        bVar3 = false;
        CTcTokenizer::log_error(0x2bc5);
      }
      if (bVar3) {
        if (bVar4) {
          add_inherited_templates(this,(CTcSymObj *)this_00,local_88,(size_t)item_cnt);
        }
        else {
          add_template_def(this,(CTcSymObj *)this_00,local_88,local_70);
        }
      }
      return (CTPNStmTop *)0x0;
    }
  } while( true );
}

Assistant:

CTPNStmTop *CTcParser::parse_template_def(int *err, const CTcToken *class_tok)
{
    CTcToken prop_tok;
    CTcObjTemplateItem *alt_group_head;
    CTcObjTemplateItem *item_head;
    CTcObjTemplateItem *item_tail;
    CTcSymObj *class_sym;

    /* no items in our list yet */
    item_head = item_tail = alt_group_head = 0;
    size_t item_cnt = 0;

    /* presume we won't find an 'inherited' token */
    int found_inh = FALSE;

    /* 
     *   If there's a class token, it must refer to an object class.  If
     *   there's no such symbol defined yet, define it as an external
     *   object; otherwise, make sure the existing symbol is an object of
     *   metaclass tads-object.  
     */
    if (class_tok != 0)
    {
        /* 
         *   if the class token is 'string', it's a string template rather
         *   than an object template - go parse that separately if so 
         */
        if (class_tok->text_matches("string"))
            return parse_string_template_def(err);

        /* 
         *   Look up the symbol.  Don't mark the symbol as referenced; merely
         *   defining a template for an object doesn't require an external
         *   reference on the object.  
         */
        class_sym = (CTcSymObj *)get_global_symtab()->find_noref(
            class_tok->get_text(), class_tok->get_text_len(), 0);

        /* 
         *   if we didn't find it, define it; otherwise, ensure it's defined
         *   as an object 
         */
        if (class_sym == 0)
        {
            /* 
             *   it's undefined, so add a forward definition by creating the
             *   symbol as an external object 
             */
            class_sym = new CTcSymObj(class_tok->get_text(),
                                      class_tok->get_text_len(), FALSE,
                                      G_cg->new_obj_id(), TRUE,
                                      TC_META_TADSOBJ, 0);

            /* add it to the master symbol table */
            get_global_symtab()->add_entry(class_sym);
        }
        else if (class_sym->get_type() != TC_SYM_OBJ
                 || class_sym->get_metaclass() != TC_META_TADSOBJ)
        {
            /* it's defined incorrectly - flag the error */
            G_tok->log_error_curtok(TCERR_REDEF_AS_OBJ);

            /* forget the conflicting symbol and proceed with parsing */
            class_sym = 0;
        }
    }
    else
    {
        /* this is a root object template - there's no class symbol */
        class_sym = 0;
    }

    /* move on to the next token */
    G_tok->next();

    /* keep going until we run out of template tokens */
    int all_ok = TRUE;
    for (int done = FALSE ; !done ; )
    {
        tc_toktyp_t def_tok;
        int ok;
        int is_inh;
        int is_alt, is_opt;

        /* presume we will find a valid token */
        ok = TRUE;

        /* presume the defining token type is the current token */
        def_tok = G_tok->cur();

        /* presume this won't be an 'inherited' token */
        is_inh = FALSE;

        /* see what we have next */
        switch(G_tok->cur())
        {
        case TOKT_SEM:
            /* 
             *   that's the end of the statement - skip the semicolon, and
             *   we're done 
             */
            G_tok->next();
            done = TRUE;
            break;

        case TOKT_INHERITED:
            /* flag that we are to inherit superclass templates */
            is_inh = TRUE;
            found_inh = TRUE;
            break;

        case TOKT_SSTR:
        case TOKT_DSTR:
            /* string property */
            {
                utf8_ptr p;
                size_t rem;
                int valid;
                tc_toktyp_t kwtok;

                /* this is our property name token */
                prop_tok = *G_tok->copycur();

                /* 
                 *   this is also our defining token - the actual value in
                 *   object instances will use this string type 
                 */
                def_tok = G_tok->cur();
                
                /* 
                 *   make sure that the contents of the string forms a
                 *   valid symbol token 
                 */

                /* set up at the start of the token */
                p.set((char *)G_tok->getcur()->get_text());
                rem = G_tok->getcur()->get_text_len();

                /* make sure the first character is valid */
                valid = (rem != 0 && is_syminit(p.getch()));
                
                /* skip the first character */
                if (rem != 0)
                    p.inc(&rem);

                /* scan the rest of the string */
                for ( ; rem != 0 && valid ; p.inc(&rem))
                {
                    /* 
                     *   if this isn't a valid symbol character, we don't
                     *   have a valid symbol 
                     */
                    if (!is_sym(p.getch()))
                        valid = FALSE;
                }

                /* 
                 *   if the string is lexically valid as a symbol, make
                 *   sure it's not a keyword - if it is, it can't be a
                 *   property name 
                 */
                if (valid && G_tok->look_up_keyword(G_tok->getcur(), &kwtok))
                    valid = FALSE;

                /* if the symbol isn't valid, it's an error */
                if (!valid)
                {
                    /* log the error */
                    G_tok->log_error_curtok(TCERR_OBJ_TPL_STR_REQ_PROP);

                    /* note the problem */
                    ok = FALSE;
                }
            }
            break;

        case TOKT_LBRACK:
            /* list property - defining instances will use lists here */
            def_tok = G_tok->cur();

            /* the next token must be the property name */
            if (G_tok->next() != TOKT_SYM)
            {
                /* log an error */
                G_tok->log_error(TCERR_OBJ_TPL_OP_REQ_PROP,
                                 G_tok->get_op_text(def_tok),
                                 (int)G_tok->getcur()->get_text_len(),
                                 G_tok->getcur()->get_text());

                /* note that we don't have a valid token */
                ok = FALSE;

                /* 
                 *   if this token isn't ']' or something that looks like
                 *   an end-of-statement token, skip it 
                 */
                switch(G_tok->cur())
                {
                case TOKT_SEM:
                case TOKT_EOF:
                case TOKT_LBRACE:
                case TOKT_RBRACE:
                    /* 
                     *   don't skip any of these - they might be statement
                     *   enders 
                     */
                    break;

                case TOKT_RBRACK:
                    /* 
                     *   they must simply have left out the property - don't
                     *   skip this, since we'll skip a token shortly anyway 
                     */
                    break;

                default:
                    /* skip the errant token */
                    G_tok->next();
                    break;
                }
            }
            else
            {
                /* remember the property token */
                prop_tok = *G_tok->copycur();

                /* require the ']' token */
                if (G_tok->next() != TOKT_RBRACK)
                {
                    /* log the error */
                    G_tok->log_error_curtok(TCERR_OBJ_TPL_REQ_RBRACK);

                    /* 
                     *   proceed on the assumption that they simply left
                     *   out the ']' 
                     */
                }
            }
            break;

        case TOKT_AT:
        case TOKT_PLUS:
        case TOKT_MINUS:
        case TOKT_TIMES:
        case TOKT_DIV:
        case TOKT_MOD:
        case TOKT_ARROW:
        case TOKT_AND:
        case TOKT_NOT:
        case TOKT_BNOT:
        case TOKT_COMMA:
            /* the operator is the defining token */
            def_tok = G_tok->cur();

            /* the next token must be the property name */
            if (G_tok->next() != TOKT_SYM)
            {
                /* log an error */
                G_tok->log_error(TCERR_OBJ_TPL_OP_REQ_PROP,
                                 G_tok->get_op_text(def_tok),
                                 (int)G_tok->getcur()->get_text_len(),
                                 G_tok->getcur()->get_text());
                
                /* note that we don't have a valid token */
                ok = FALSE;
            }

            /* remember the property token */
            prop_tok = *G_tok->copycur();
            break;

        case TOKT_LBRACE:
        case TOKT_RBRACE:
        case TOKT_EOF:
        case TOKT_OBJECT:
            /* they must have left off the ';' */
            G_tok->log_error_curtok(TCERR_OBJ_TPL_BAD_TOK);

            /* 
             *   stop parsing here, assuming the statement should have
             *   ended by now 
             */
            done = TRUE;
            ok = FALSE;
            break;

        default:
            /* log an error and skip the invalid token */
            G_tok->log_error_curtok(TCERR_OBJ_TPL_BAD_TOK);
            G_tok->next();
            ok = FALSE;
            break;
        }

        /* presume we won't find an alternative or optionality suffix */
        is_opt = FALSE;
        is_alt = FALSE;

        /* 
         *   if we haven't reached the end of the statement, check to see if
         *   the item is optional or an alternative 
         */
        if (!done)
        {
            /* get the next token */
            G_tok->next();
            
            /* check to see if the item is optional */
            if (G_tok->cur() == TOKT_QUESTION)
            {
                /* it's optional */
                is_opt = TRUE;

                /* skip the '?' */
                G_tok->next();
            }

            /* check for an alternative */
            if (G_tok->cur() == TOKT_OR)
            {
                /* this item is an alternative */
                is_alt = TRUE;

                /* skip the '|' */
                G_tok->next();
            }
        }

        /* 
         *   If the previous item was followed by '|', we're in the same
         *   alternative group with that item.  This means we're optional if
         *   it's marked as optional, and all of the preceding items in our
         *   group are optional if we're marked as optional.  
         */
        if (item_tail != 0 && item_tail->is_alt_)
        {
            /* 
             *   if we're optional, mark all prior items in the group as
             *   optional 
             */
            if (is_opt)
            {
                CTcObjTemplateItem *item;

                /* mark everything in our group as optional */
                for (item = alt_group_head ; item != 0 ; item = item->nxt_)
                    item->is_opt_ = TRUE;
            }
            
            /* if the prior item was optional, we're optional */
            if (item_tail->is_opt_)
                is_opt = TRUE;
        }

        /* 
         *   if we encountered any problems, note that we have an error in
         *   the overall statement 
         */
        if (!ok)
            all_ok = FALSE;

        /* if we found a valid property token, add it to the template */
        if (!done && ok)
        {
            CTcSymProp *prop_sym;
            CTcObjTemplateItem *item;

            /* presume we won't create a new item */
            item = 0;

            /* check to see if it's a property or an 'inherited' token */
            if (is_inh)
            {
                /* create an 'inherited' template item */
                item = new (G_prsmem)
                       CTcObjTemplateItem(0, TOKT_INHERITED, FALSE, FALSE);
            }
            else
            {
                /* make sure we have a valid property name */
                prop_sym = look_up_prop(&prop_tok, FALSE);
                if (prop_sym == 0)
                {
                    /* couldn't find the property - log an error */
                    G_tok->log_error(TCERR_OBJ_TPL_SYM_NOT_PROP,
                                     (int)prop_tok.get_text_len(),
                                     prop_tok.get_text());
                }
                else if (prop_sym->is_vocab())
                {
                    /* dictionary properties are not valid in templates */
                    G_tok->log_error(TCERR_OBJ_TPL_NO_VOCAB,
                                     (int)prop_sym->get_sym_len(),
                                     prop_sym->get_sym());
                }
                else
                {
                    /* 
                     *   Scan the list so far to ensure that this same
                     *   property isn't already part of the list.  However,
                     *   do allow duplicates within the run of alternatives
                     *   of which the new item will be a part, since we'll
                     *   only end up using one of the alternatives and hence
                     *   the property will only be entered once in the
                     *   property even if it appears multiple times in the
                     *   run.  The run of alternatives of which we're a part
                     *   is the final run in the list, since we're being
                     *   added at the end of the list.  
                     */
                    for (item = item_head ; item != 0 ; item = item->nxt_)
                    {
                        /* check for a duplicate of this item's property */
                        if (item->prop_ == prop_sym)
                        {
                            CTcObjTemplateItem *sub;
                            
                            /* 
                             *   if everything from here to the end of the
                             *   list is marked as an alternative, then we're
                             *   just adding a duplicate property to a run of
                             *   alternatives, which is fine 
                             */
                            for (sub = item ; sub != 0 && sub->is_alt_ ;
                                 sub = sub->nxt_) ;

                            /* 
                             *   if we found a non-alternative following this
                             *   item, then this is indeed a duplicate; if we
                             *   didn't find any non-alternatives, we're just
                             *   adding this to a run of alternatives, so
                             *   we're okay 
                             */
                            if (sub != 0)
                            {
                                /* it's a duplicate - log the error */
                                G_tok->log_error(TCERR_OBJ_TPL_PROP_DUP,
                                    (int)prop_sym->get_sym_len(),
                                    prop_sym->get_sym());
                            
                                /* no need to look any further */
                                break;
                            }
                        }
                    }
                    
                    /* create the template item */
                    item = new (G_prsmem)
                           CTcObjTemplateItem(prop_sym, def_tok,
                                              is_alt, is_opt);
                }
            }
            
            /* if we have a valid new item, add it to our list */
            if (item != 0)
            {
                /* 
                 *   if we're an alternative and the prior item was not,
                 *   we're the head of a new alternative group; if we're not
                 *   an alternative, then we're not in an alternative group
                 *   after this item 
                 */
                if (is_alt && (item_tail == 0 || !item_tail->is_alt_))
                {
                    /* we're the head of a new group */
                    alt_group_head = item;
                }
                else if (!is_alt)
                {
                    /* we're no longer in an alternative group */
                    alt_group_head = 0;
                }

                /* link it into our list */
                if (item_tail != 0)
                    item_tail->nxt_ = item;
                else
                    item_head = item;
                item_tail = item;
            
                /* count it */
                ++item_cnt;
            }
        }
    }

    /* if the template is empty, warn about it */
    if (item_cnt == 0)
    {
        /* flag it as an error */
        G_tok->log_error(TCERR_TEMPLATE_EMPTY);

        /* there's no point in saving an empty template */
        all_ok = FALSE;
    }

    /* if we were successful, add the new template to our master list */
    if (all_ok)
    {
        /*
         *   If we found an 'inherited' keyword, we must expand the template
         *   with all inherited templates.  Otherwise, simply add the
         *   template exactly as given. 
         */
        if (found_inh)
        {
            /*
             *   Traverse all superclass templates and add each inherited
             *   form. 
             */
            add_inherited_templates(class_sym, item_head, item_cnt);
        }
        else
        {
            /* add our single template */
            add_template_def(class_sym, item_head, item_cnt);
        }
    }

    /* an 'object template' statement generates no tree data */
    return 0;
}